

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O2

real_t __thiscall
xLearn::Trainer::calc_gradient
          (Trainer *this,vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *reader)

{
  pointer ppRVar1;
  Reader *pRVar2;
  int iVar3;
  ostream *poVar4;
  int i;
  ulong uVar5;
  real_t extraout_XMM0_Da;
  allocator local_66;
  allocator local_65;
  Logger local_64;
  DMatrix *matrix;
  string local_40;
  
  if ((reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    (*this->loss_->_vptr_Loss[7])();
    uVar5 = 0;
    while( true ) {
      ppRVar1 = (reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(reader->
                        super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <= uVar5)
      break;
      (*ppRVar1[uVar5]->_vptr_Reader[5])();
      matrix = (DMatrix *)0x0;
      while( true ) {
        pRVar2 = (reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar5];
        iVar3 = (*pRVar2->_vptr_Reader[4])(pRVar2,&matrix);
        if (iVar3 == 0) break;
        (*this->loss_->_vptr_Loss[4])(this->loss_,matrix,this->model_);
      }
      uVar5 = uVar5 + 1;
    }
    (*this->loss_->_vptr_Loss[6])();
    return extraout_XMM0_Da;
  }
  local_64.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&matrix,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.cc"
             ,&local_65);
  std::__cxx11::string::string((string *)&local_40,"calc_gradient",&local_66);
  poVar4 = Logger::Start(ERR,(string *)&matrix,0xfc,&local_40);
  poVar4 = std::operator<<(poVar4,"CHECK_NE failed ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.cc"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xfc);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"reader.empty()");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"true");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&matrix);
  Logger::~Logger(&local_64);
  abort();
}

Assistant:

real_t Trainer::calc_gradient(std::vector<Reader*>& reader) {
  CHECK_NE(reader.empty(), true);
  loss_->Reset();
  for (int i = 0; i < reader.size(); ++i) {
    reader[i]->Reset();
    DMatrix* matrix = nullptr;
    for (;;) {
      index_t tmp = reader[i]->Samples(matrix);
      if (tmp == 0) { break; }
      loss_->CalcGrad(matrix, *model_);
    }
  }
  return loss_->GetLoss();
}